

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

void Pln_ManPrintFinal(Pln_Man_t *p,int fVerbose,int fVeryVerbose)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Hsh_VecMan_t *pHVar4;
  int iVar5;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  pVVar7 = p->vCoefs;
  if (pVVar7->nSize < 1) {
    uVar10 = 0;
  }
  else {
    lVar8 = 0;
    uVar9 = 0;
    do {
      uVar2 = pVVar7->pArray[lVar8];
      if ((ulong)uVar2 == 0) {
        uVar10 = (ulong)uVar9;
      }
      else {
        uVar10 = (ulong)(uVar9 + 1);
        if ((int)uVar9 < 0x19 && fVerbose != 0) {
          if ((int)uVar2 < 0) {
LAB_005e6c36:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pHVar4 = p->pHashC;
          if (pHVar4->vMap->nSize <= (int)uVar2) goto LAB_005e6c36;
          iVar3 = pHVar4->vMap->pArray[uVar2];
          if (((long)iVar3 < 0) || (pHVar4->vData->nSize <= iVar3)) {
LAB_005e6c17:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar1 = pHVar4->vData->pArray + iVar3;
          iVar3 = *piVar1;
          (pHVar4->vTemp).nCap = iVar3;
          (pHVar4->vTemp).nSize = iVar3;
          (pHVar4->vTemp).pArray = piVar1 + 2;
          if (0 < iVar3) {
            lVar11 = 0;
            do {
              pcVar6 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +"
              ;
              iVar3 = (pHVar4->vTemp).pArray[lVar11];
              if (iVar3 < 0) {
                pcVar6 = 
                "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
              }
              iVar5 = -iVar3;
              if (0 < iVar3) {
                iVar5 = iVar3;
              }
              printf("%s%d",pcVar6 + 0x4a,(ulong)(uint)(1 << ((char)iVar5 - 1U & 0x1f)));
              lVar11 = lVar11 + 1;
            } while (lVar11 < (pHVar4->vTemp).nSize);
          }
          pHVar4 = p->pHashM;
          if (pHVar4->vMap->nSize <= lVar8) goto LAB_005e6c36;
          iVar3 = pHVar4->vMap->pArray[lVar8];
          if (((long)iVar3 < 0) || (pHVar4->vData->nSize <= iVar3)) goto LAB_005e6c17;
          piVar1 = pHVar4->vData->pArray + iVar3;
          iVar3 = *piVar1;
          (pHVar4->vTemp).nCap = iVar3;
          (pHVar4->vTemp).nSize = iVar3;
          (pHVar4->vTemp).pArray = piVar1 + 2;
          if (0 < iVar3) {
            lVar11 = 0;
            do {
              printf(" * %d",(ulong)(uint)(pHVar4->vTemp).pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < (pHVar4->vTemp).nSize);
          }
          putchar(10);
          pVVar7 = p->vCoefs;
          uVar10 = (ulong)(uVar9 + 1);
        }
      }
      lVar8 = lVar8 + 1;
      uVar9 = (uint)uVar10;
    } while (lVar8 < pVVar7->nSize);
  }
  printf("HashC = %d. HashM = %d.  Total = %d. Used = %d.\n",(ulong)(uint)p->pHashC->vMap->nSize,
         (ulong)(uint)p->pHashM->vMap->nSize,(ulong)(uint)p->nBuilds,uVar10);
  return;
}

Assistant:

void Pln_ManPrintFinal( Pln_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vArray;
    int k, Entry, iMono, iConst, Count = 0;
    Vec_IntForEachEntry( p->vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;

        Count++;

        if ( !fVerbose )
            continue;

        if ( Count > 25 )
            continue;

        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( "%s%d", Entry < 0 ? "-" : "+", (1 << (Abc_AbsInt(Entry)-1)) );

        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( " * %d", Entry );
        printf( "\n" );
    }
    printf( "HashC = %d. HashM = %d.  Total = %d. Used = %d.\n", Hsh_VecSize(p->pHashC), Hsh_VecSize(p->pHashM), p->nBuilds, Count );
}